

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grisu.h
# Opt level: O1

void floaxie::grisu2<_19,_16,float,char>(float v,char *buffer,int *length,int *K)

{
  undefined1 auVar1 [12];
  mantissa_storage_type mVar2;
  exponent_storage_type eVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  double dVar14;
  pair<floaxie::diy_fp<float,_floaxie::diy_fp_traits<float>_>,_floaxie::diy_fp<float,_floaxie::diy_fp_traits<float>_>_>
  local_48;
  int *local_38;
  
  local_38 = length;
  local_48 = diy_fp<float,_floaxie::diy_fp_traits<float>_>::boundaries(v);
  eVar3 = local_48.second.m_e;
  if (local_48.second.m_e < -0x14) {
    dVar14 = 1.0;
  }
  else {
    dVar14 = 0.0;
  }
  iVar4 = (int)((double)-(local_48.second.m_e + 0x14) * 0.30102999566398114 + dVar14);
  if (-0x33 < iVar4) {
    mVar2 = local_48.second.m_f;
    uVar6 = *(uint *)(powers_ten<float>::f + (long)iVar4 * 4 + 200) >> 0x10;
    uVar8 = *(uint *)(powers_ten<float>::f + (long)iVar4 * 4 + 200) & 0xffff;
    uVar13 = (local_48.first.m_f & 0xffff) * uVar6;
    uVar9 = (local_48.first.m_f >> 0x10) * uVar8;
    iVar7 = ((uVar13 & 0xffff) + 0x8000 +
             (uVar9 & 0xffff) + ((local_48.first.m_f & 0xffff) * uVar8 >> 0x10) >> 0x10) +
            (uVar13 >> 0x10) + (uVar9 >> 0x10) + (local_48.first.m_f >> 0x10) * uVar6;
    iVar10 = *(int *)(powers_ten<float>::e + (long)iVar4 * 4 + 200) + 0x20 + local_48.first.m_e;
    auVar1._4_4_ = local_48.second.m_f;
    auVar1._8_4_ = local_48.second.m_e;
    auVar1._0_4_ = iVar10;
    local_48.first = (diy_fp<float,_floaxie::diy_fp_traits<float>_>)(auVar1._0_8_ << 0x20);
    uVar11 = mVar2 >> 0x10;
    uVar13 = mVar2 & 0xffff;
    uVar9 = uVar6 * uVar13;
    uVar12 = uVar11 * uVar8;
    uVar6 = ((uVar9 & 0xffff) + 0x8000 + (uVar12 & 0xffff) + (uVar13 * uVar8 >> 0x10) >> 0x10) +
            (uVar9 >> 0x10) + (uVar12 >> 0x10) + uVar11 * uVar6;
    local_48.second.m_f = uVar6;
    iVar5 = eVar3 + *(int *)(powers_ten<float>::e + (long)iVar4 * 4 + 200);
    local_48.second.m_e = iVar5 + 0x20;
    if (iVar7 == -1) {
      local_48.first.m_e = iVar10 + 1;
      local_48.first.m_f = 0x80000000;
    }
    else {
      local_48.first.m_f = iVar7 + 1;
    }
    if (uVar6 < 2) {
      local_48.second.m_f = uVar6 * 2 + -1;
      local_48.second.m_e = iVar5 + 0x1f;
    }
    else {
      local_48.second.m_f = uVar6 - 1;
    }
    *K = -iVar4;
    digit_gen_select<false>::gen<float,char>(&local_48.second,&local_48.first,buffer,local_38,K);
    return;
  }
  __assert_fail("k >= -static_cast<int>(powers_ten<FloatType>::pow_0_offset)",
                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/floaxie/floaxie/cached_power.h"
                ,0x2d,"diy_fp<FloatType> floaxie::cached_power(int) [FloatType = float]");
}

Assistant:

inline void grisu2(FloatType v, CharType* buffer, int* length, int* K) noexcept
	{
		static_assert(alpha <= gamma - 3,
			"It's imposed that γ ⩾ α + 3, since otherwise it's not always possible to find a proper decimal cached power");

		std::pair<diy_fp<FloatType>, diy_fp<FloatType>>&& w(diy_fp<FloatType>::boundaries(v));
		diy_fp<FloatType> &w_m(w.first), &w_p(w.second);

		const int mk = k_comp_exp<alpha, gamma>(w_p.exponent());
		const diy_fp<FloatType>& c_mk(cached_power<FloatType>(mk));

		w_m *= c_mk;
		w_p *= c_mk;

		++w_m;
		--w_p;

		*K = -mk;

		digit_gen<alpha, gamma>(w_p, w_m, buffer, length, K);
	}